

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O0

void __thiscall
duckdb::ParquetReader::ParquetReader
          (ParquetReader *this,ClientContext *context_p,ParquetOptions *parquet_options_p,
          shared_ptr<duckdb::ParquetFileMetadataCache,_true> *metadata_p)

{
  undefined8 uVar1;
  ClientContext *in_RSI;
  undefined8 *in_RDI;
  ParquetOptions *in_stack_ffffffffffffff18;
  ParquetOptions *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  OpenFileInfo *in_stack_ffffffffffffff30;
  OpenFileInfo *in_stack_ffffffffffffff38;
  BaseFileReader *in_stack_ffffffffffffff40;
  string local_70 [96];
  ClientContext *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_70);
  OpenFileInfo::OpenFileInfo(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  BaseFileReader::BaseFileReader(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  OpenFileInfo::~OpenFileInfo((OpenFileInfo *)in_stack_ffffffffffffff20);
  std::__cxx11::string::~string(local_70);
  *in_RDI = &PTR__ParquetReader_00bffc40;
  duckdb::CachingFileSystem::Get((ClientContext *)(in_RDI + 0x21));
  uVar1 = duckdb::BufferAllocator::Get(local_10);
  in_RDI[0x23] = uVar1;
  shared_ptr<duckdb::ParquetFileMetadataCache,_true>::shared_ptr
            ((shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)in_stack_ffffffffffffff20,
             (shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)in_stack_ffffffffffffff18);
  ParquetOptions::ParquetOptions(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>::
  unique_ptr((unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
              *)0x69ea7b);
  shared_ptr<duckdb::EncryptionUtil,_true>::shared_ptr
            ((shared_ptr<duckdb::EncryptionUtil,_true> *)0x69ea91);
  std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)in_stack_ffffffffffffff20,
             (__integral_type)in_stack_ffffffffffffff18);
  unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>::
  unique_ptr((unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
              *)0x69eabe);
  InitializeSchema((ParquetReader *)parquet_options_p,(ClientContext *)metadata_p);
  return;
}

Assistant:

ParquetReader::ParquetReader(ClientContext &context_p, ParquetOptions parquet_options_p,
                             shared_ptr<ParquetFileMetadataCache> metadata_p)
    : BaseFileReader(string()), fs(CachingFileSystem::Get(context_p)), allocator(BufferAllocator::Get(context_p)),
      metadata(std::move(metadata_p)), parquet_options(std::move(parquet_options_p)), rows_read(0) {
	InitializeSchema(context_p);
}